

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlookup.cpp
# Opt level: O1

int __thiscall
CVmObjLookupTable::getp_make_list
          (CVmObjLookupTable *this,vm_obj_id_t self,vm_val_t *retval,uint *argc,int store_keys)

{
  vm_datatype_t *pvVar1;
  vm_val_t *pvVar2;
  int iVar3;
  
  if (getp_make_list(unsigned_int,vm_val_t*,unsigned_int*,int)::desc == '\0') {
    getp_make_list();
  }
  iVar3 = CVmObject::get_prop_check_argc(retval,argc,&getp_make_list::desc);
  pvVar2 = sp_;
  if (iVar3 == 0) {
    pvVar1 = &sp_->typ;
    sp_ = sp_ + 1;
    *pvVar1 = VM_OBJ;
    (pvVar2->val).obj = self;
    make_list(this,retval,store_keys,(_func_int_vm_val_t_ptr_vm_val_t_ptr *)0x0);
    sp_ = sp_ + -1;
  }
  return 1;
}

Assistant:

int CVmObjLookupTable::getp_make_list(VMG_ vm_obj_id_t self,
                                      vm_val_t *retval, uint *argc,
                                      int store_keys)
{
    static CVmNativeCodeDesc desc(0);

    /* check arguments */
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* push self while we're working, for gc protection */
    G_stk->push()->set_obj(self);

    /* make the list */
    make_list(vmg_ retval, store_keys, 0);
    
    /* discard our gc protection */
    G_stk->discard();

    /* handled */
    return TRUE;
}